

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

void vrna_md_defaults_reset(vrna_md_t *md_p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 extraout_EAX;
  uint uVar5;
  undefined4 extraout_EAX_00;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  int iVar13;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  
  uVar6 = 1;
  defaults.noLP = 0;
  defaults.noGU = 0;
  defaults.noGUclosure = 0;
  defaults.logML = 0;
  defaults.circ = 0;
  defaults.gquad = 0;
  defaults.uniq_ML = 0;
  defaults.backtrack_type = 'F';
  defaults.energy_set = 0;
  defaults.backtrack = 1;
  defaults.max_bp_span = -1;
  defaults.min_loop_size = 3;
  defaults.window_size = -1;
  defaults.oldAliEn = 0;
  defaults.ribo = 0;
  defaults.cv_fact = 1.0;
  defaults.nc_fact = 1.0;
  defaults.temperature = 37.0;
  defaults.betaScale = 1.0;
  defaults.pf_smooth = 1;
  defaults.dangles = 2;
  defaults.sfact = 1.07;
  defaults.nonstandards[0] = '\0';
  defaults.special_hp = uVar6;
  defaults.compute_bpp = uVar6;
  if (md_p != (vrna_md_t *)0x0) {
    vrna_md_defaults_dangles(md_p->dangles);
    uVar1 = md_p->special_hp;
    uVar3 = md_p->noLP;
    iVar9 = -(uint)(uVar1 == 0);
    iVar13 = -(uint)(uVar3 == 0);
    auVar14._4_4_ = iVar9;
    auVar14._0_4_ = iVar9;
    auVar14._8_4_ = iVar13;
    auVar14._12_4_ = iVar13;
    uVar5 = movmskpd(extraout_EAX,auVar14);
    tetra_loop = (uVar5 ^ 3) & 1;
    uVar10 = ~CONCAT44(iVar13,iVar9) & (ulong)DAT_002d8890;
    defaults.special_hp = (int)uVar10;
    defaults.noLP = (int)(uVar10 >> 0x20);
    noLonelyPairs = (uVar5 ^ 3) >> 1 & 0x7f;
    vrna_md_defaults_noGU(md_p->noGU);
    auVar11._0_4_ = -(uint)(md_p->noGUclosure == 0);
    auVar11._4_4_ = -(uint)(md_p->logML == 0);
    auVar11._8_4_ = -(uint)(md_p->circ == 0);
    auVar11._12_4_ = -(uint)(md_p->gquad == 0);
    uVar5 = movmskps(extraout_EAX_00,auVar11);
    bVar7 = (byte)(uVar5 ^ 0xf);
    no_closingGU = (uVar5 ^ 0xf) & 1;
    logML = (int)((bVar7 & 2) >> 1);
    defaults.noGUclosure = ~auVar11._0_4_ & 1;
    defaults.logML = ~auVar11._4_4_ & 1;
    defaults.circ = ~auVar11._8_4_ & 1;
    gquad = (int)(bVar7 >> 3);
    circ = (int)((bVar7 & 4) >> 2);
    bVar8 = md_p->uniq_ML != 0;
    uniq_ML = (int)bVar8;
    defaults.uniq_ML._1_3_ = 0;
    defaults._48_5_ = CONCAT14(bVar8,~auVar11._12_4_) & 0xff00000001;
    uVar5 = md_p->compute_bpp;
    defaults.compute_bpp = uVar6;
    if (uVar5 < 3) {
      defaults.compute_bpp = uVar5;
      do_backtrack = uVar5;
    }
    defaults.backtrack._0_1_ = md_p->backtrack != 0;
    defaults.backtrack._1_3_ = 0;
    vrna_md_defaults_backtrack_type(md_p->backtrack_type);
    vrna_md_defaults_energy_set(md_p->energy_set);
    max_bp_span = md_p->max_bp_span;
    if (md_p->max_bp_span < 1) {
      max_bp_span = -1;
    }
    defaults.min_loop_size = 0;
    if (0 < md_p->min_loop_size) {
      defaults.min_loop_size = md_p->min_loop_size;
    }
    defaults.max_bp_span = max_bp_span;
    defaults.window_size = md_p->window_size;
    if (defaults.window_size < 1) {
      defaults.window_size = -1;
    }
    uVar2 = md_p->oldAliEn;
    uVar4 = md_p->ribo;
    iVar9 = -(uint)(uVar2 == 0);
    iVar13 = -(uint)(uVar4 == 0);
    auVar12._4_4_ = iVar9;
    auVar12._0_4_ = iVar9;
    auVar12._8_4_ = iVar13;
    auVar12._12_4_ = iVar13;
    uVar6 = movmskpd(defaults.window_size,auVar12);
    oldAliEn = (uVar6 ^ 3) & 1;
    uVar10 = ~CONCAT44(iVar13,iVar9) & (ulong)DAT_002d8890;
    defaults.oldAliEn = (int)uVar10;
    defaults.ribo = (int)(uVar10 >> 0x20);
    ribo = (uVar6 ^ 3) >> 1 & 0x7f;
    cv_fact = md_p->cv_fact;
    nc_fact = md_p->nc_fact;
    defaults.cv_fact = cv_fact;
    defaults.nc_fact = nc_fact;
    vrna_md_defaults_temperature(md_p->temperature);
    defaults.betaScale = md_p->betaScale;
    defaults.pf_smooth = md_p->pf_smooth;
    defaults.sfact = md_p->sfact;
    copy_nonstandards(&defaults,md_p->nonstandards);
  }
  vrna_md_update(&defaults);
  temperature = defaults.temperature;
  pf_scale = -1.0;
  dangles = defaults.dangles;
  tetra_loop = defaults.special_hp;
  noLonelyPairs = defaults.noLP;
  noGU = defaults.noGU;
  no_closingGU = defaults.noGUclosure;
  circ = defaults.circ;
  gquad = defaults.gquad;
  uniq_ML = defaults.uniq_ML;
  energy_set = defaults.energy_set;
  do_backtrack = defaults.compute_bpp;
  backtrack_type = defaults.backtrack_type;
  nonstandards = defaults.nonstandards;
  max_bp_span = defaults.max_bp_span;
  oldAliEn = defaults.oldAliEn;
  ribo = defaults.ribo;
  cv_fact = defaults.cv_fact;
  nc_fact = defaults.nc_fact;
  logML = defaults.logML;
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_reset(vrna_md_t *md_p)
{
  /* first, reset to factory defaults */
  defaults.dangles          = VRNA_MODEL_DEFAULT_DANGLES;
  defaults.special_hp       = VRNA_MODEL_DEFAULT_SPECIAL_HP;
  defaults.noLP             = VRNA_MODEL_DEFAULT_NO_LP;
  defaults.noGU             = VRNA_MODEL_DEFAULT_NO_GU;
  defaults.noGUclosure      = VRNA_MODEL_DEFAULT_NO_GU_CLOSURE;
  defaults.logML            = VRNA_MODEL_DEFAULT_LOG_ML;
  defaults.gquad            = VRNA_MODEL_DEFAULT_GQUAD;
  defaults.circ             = VRNA_MODEL_DEFAULT_CIRC;
  defaults.uniq_ML          = VRNA_MODEL_DEFAULT_UNIQ_ML;
  defaults.compute_bpp      = VRNA_MODEL_DEFAULT_COMPUTE_BPP;
  defaults.backtrack        = VRNA_MODEL_DEFAULT_BACKTRACK;
  defaults.backtrack_type   = VRNA_MODEL_DEFAULT_BACKTRACK_TYPE;
  defaults.energy_set       = VRNA_MODEL_DEFAULT_ENERGY_SET;
  defaults.max_bp_span      = VRNA_MODEL_DEFAULT_MAX_BP_SPAN;
  defaults.min_loop_size    = TURN;
  defaults.window_size      = VRNA_MODEL_DEFAULT_WINDOW_SIZE;
  defaults.oldAliEn         = VRNA_MODEL_DEFAULT_ALI_OLD_EN;
  defaults.ribo             = VRNA_MODEL_DEFAULT_ALI_RIBO;
  defaults.cv_fact          = VRNA_MODEL_DEFAULT_ALI_CV_FACT;
  defaults.nc_fact          = VRNA_MODEL_DEFAULT_ALI_NC_FACT;
  defaults.temperature      = VRNA_MODEL_DEFAULT_TEMPERATURE;
  defaults.betaScale        = VRNA_MODEL_DEFAULT_BETA_SCALE;
  defaults.pf_smooth        = VRNA_MODEL_DEFAULT_PF_SMOOTH;
  defaults.sfact            = 1.07;
  defaults.nonstandards[0]  = '\0';

  if (md_p) {
    /* now try to apply user settings */
    /*
     *  Note that we use wrapper functions here instead of
     *  faster direct memory copy because we want to ensure
     *  that model settings always comply to the constraints
     *  we set in the wrappers
     */
    vrna_md_defaults_dangles(md_p->dangles);
    vrna_md_defaults_special_hp(md_p->special_hp);
    vrna_md_defaults_noLP(md_p->noLP);
    vrna_md_defaults_noGU(md_p->noGU);
    vrna_md_defaults_noGUclosure(md_p->noGUclosure);
    vrna_md_defaults_logML(md_p->logML);
    vrna_md_defaults_gquad(md_p->gquad);
    vrna_md_defaults_circ(md_p->circ);
    vrna_md_defaults_uniq_ML(md_p->uniq_ML);
    vrna_md_defaults_compute_bpp(md_p->compute_bpp);
    vrna_md_defaults_backtrack(md_p->backtrack);
    vrna_md_defaults_backtrack_type(md_p->backtrack_type);
    vrna_md_defaults_energy_set(md_p->energy_set);
    vrna_md_defaults_max_bp_span(md_p->max_bp_span);
    vrna_md_defaults_min_loop_size(md_p->min_loop_size);
    vrna_md_defaults_window_size(md_p->window_size);
    vrna_md_defaults_oldAliEn(md_p->oldAliEn);
    vrna_md_defaults_ribo(md_p->ribo);
    vrna_md_defaults_cv_fact(md_p->cv_fact);
    vrna_md_defaults_nc_fact(md_p->nc_fact);
    vrna_md_defaults_temperature(md_p->temperature);
    vrna_md_defaults_betaScale(md_p->betaScale);
    vrna_md_defaults_pf_smooth(md_p->pf_smooth);
    vrna_md_defaults_sfact(md_p->sfact);
    copy_nonstandards(&defaults, &(md_p->nonstandards[0]));
  }

  /* update pair/rtype/alias arrays accordingly */
  vrna_md_update(&defaults);

#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
  temperature     = defaults.temperature;
  pf_scale        = VRNA_MODEL_DEFAULT_PF_SCALE;
  dangles         = defaults.dangles;
  tetra_loop      = defaults.special_hp;
  noLonelyPairs   = defaults.noLP;
  noGU            = defaults.noGU;
  no_closingGU    = defaults.noGUclosure;
  circ            = defaults.circ;
  gquad           = defaults.gquad;
  uniq_ML         = defaults.uniq_ML;
  energy_set      = defaults.energy_set;
  do_backtrack    = defaults.compute_bpp;
  backtrack_type  = defaults.backtrack_type;
  nonstandards    = defaults.nonstandards;
  max_bp_span     = defaults.max_bp_span;
  oldAliEn        = defaults.oldAliEn;
  ribo            = defaults.ribo;
  cv_fact         = defaults.cv_fact;
  nc_fact         = defaults.nc_fact;
  logML           = defaults.logML;
#endif
}